

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O2

DLS_Data * Timidity::LoadDLS(FILE *src)

{
  uint uVar1;
  uint uVar2;
  DLS_Instrument *pDVar3;
  DLS_Data *data;
  DLS_Instrument *pDVar4;
  POOLTABLE PVar5;
  DLS_Region *pDVar6;
  POOLTABLE data_00;
  RIFF_Chunk *pRVar7;
  RIFF_Chunk *pRVar8;
  WSMPL *pWVar9;
  DWORD DVar10;
  ULONG UVar11;
  int iVar12;
  DLS_Data *data_01;
  RIFF_Chunk *pRVar13;
  DLS_Instrument *pDVar14;
  DLS_Region *pDVar15;
  RIFF_Chunk **ppRVar16;
  POOLTABLE connList_ptr;
  ulong uVar17;
  DLS_Wave *pDVar18;
  char **ppcVar19;
  ulong uVar20;
  POOLTABLE *pPVar21;
  DLS_Wave *local_90;
  POOLTABLE *local_88;
  
  data_01 = (DLS_Data *)calloc(1,0x50);
  if (data_01 != (DLS_Data *)0x0) {
    pRVar13 = LoadRIFF(src);
    data_01->chunk = pRVar13;
    if (pRVar13 != (RIFF_Chunk *)0x0) {
      ppRVar16 = &pRVar13->child;
      uVar1 = 0;
      local_90 = (DLS_Wave *)0x0;
      local_88 = (POOLTABLE *)0x0;
      do {
        pRVar13 = *ppRVar16;
        if (pRVar13 == (RIFF_Chunk *)0x0) {
          return data_01;
        }
        DVar10 = pRVar13->magic;
        if (DVar10 == 0x5453494c) {
          DVar10 = pRVar13->subtype;
        }
        if (DVar10 == 0x4f464e49) {
          ppRVar16 = &pRVar13->child;
          while (pRVar7 = *ppRVar16, pRVar7 != (RIFF_Chunk *)0x0) {
            DVar10 = pRVar7->magic;
            if (DVar10 == 0x5453494c) {
              DVar10 = pRVar7->subtype;
            }
            ppcVar19 = &data_01->name;
            if ((((DVar10 == 0x4d414e49) || (ppcVar19 = &data_01->copyright, DVar10 == 0x504f4349))
                || (ppcVar19 = &data_01->artist, DVar10 == 0x54524149)) ||
               (ppcVar19 = &data_01->comments, DVar10 == 0x544d4349)) {
              *ppcVar19 = (char *)pRVar7->data;
            }
            ppRVar16 = &pRVar7->next;
          }
        }
        else if (DVar10 == 0x736e696c) {
          uVar17 = 0;
          ppRVar16 = &pRVar13->child;
          while (pRVar7 = *ppRVar16, pRVar7 != (RIFF_Chunk *)0x0) {
            DVar10 = pRVar7->magic;
            if (DVar10 == 0x5453494c) {
              DVar10 = pRVar7->subtype;
            }
            if ((DVar10 == 0x20736e69) && ((uint)uVar17 < uVar1)) {
              pDVar3 = data_01->instruments;
              connList_ptr = (POOLTABLE)(uVar17 * 0x28);
              pDVar14 = pDVar3 + uVar17;
              ppRVar16 = &pRVar7->child;
              while (data = (DLS_Data *)*ppRVar16, data != (DLS_Data *)0x0) {
                DVar10 = *(DWORD *)&data->chunk;
                if (DVar10 == 0x5453494c) {
                  DVar10 = data->cInstruments;
                }
                if (DVar10 == 0x3272616c) {
LAB_00346369:
                  Parse_lart(data,(RIFF_Chunk *)&pDVar3[uVar17].art,
                             (CONNECTIONLIST **)&pDVar3[uVar17].artList,(CONNECTION **)connList_ptr)
                  ;
                }
                else if (DVar10 == 0x4f464e49) {
                  pPVar21 = (POOLTABLE *)&data->ptbl;
                  while (PVar5 = *pPVar21, PVar5 != (POOLTABLE)0x0) {
                    uVar2 = *(uint *)PVar5;
                    if (uVar2 == 0x5453494c) {
                      uVar2 = ((POOLTABLE *)((long)PVar5 + 8))->cbSize;
                    }
                    connList_ptr.cCues = 0;
                    connList_ptr.cbSize = uVar2;
                    if (uVar2 == 0x4d414e49) {
                      connList_ptr = *(POOLTABLE *)((long)PVar5 + 0x10);
                      pDVar14->name = (char *)connList_ptr;
                    }
                    pPVar21 = (POOLTABLE *)((long)PVar5 + 0x20);
                  }
                }
                else {
                  if (DVar10 == 0x7472616c) goto LAB_00346369;
                  if (DVar10 == 0x6e67726c) {
                    uVar20 = 0;
                    pPVar21 = (POOLTABLE *)&data->ptbl;
                    while (PVar5 = *pPVar21, PVar5 != (POOLTABLE)0x0) {
                      UVar11 = *(ULONG *)PVar5;
                      if (UVar11 == 0x5453494c) {
                        UVar11 = ((POOLTABLE *)((long)PVar5 + 8))->cbSize;
                      }
                      if (((UVar11 == 0x326e6772) || (UVar11 == 0x206e6772)) &&
                         ((uint)uVar20 < pDVar14->header->cRegions)) {
                        pDVar6 = pDVar14->regions;
                        connList_ptr = (POOLTABLE)(uVar20 * 0x30);
                        pDVar15 = pDVar6 + uVar20;
                        pPVar21 = (POOLTABLE *)((long)PVar5 + 0x18);
                        while (data_00 = *pPVar21, data_00 != (POOLTABLE)0x0) {
                          iVar12 = *(int *)data_00;
                          if (iVar12 == 0x5453494c) {
                            iVar12 = *(int *)((long)data_00 + 8);
                          }
                          if ((iVar12 == 0x3272616c) || (iVar12 == 0x7472616c)) {
                            Parse_lart((DLS_Data *)data_00,(RIFF_Chunk *)&pDVar6[uVar20].art,
                                       (CONNECTIONLIST **)&pDVar6[uVar20].artList,
                                       (CONNECTION **)connList_ptr);
                          }
                          else if (iVar12 == 0x6b6e6c77) {
                            pDVar15->wlnk = *(WAVELINK **)((long)data_00 + 0x10);
                          }
                          else if (iVar12 == 0x706d7377) {
                            pWVar9 = *(WSMPL **)((long)data_00 + 0x10);
                            connList_ptr = (POOLTABLE)
                                           ((long)&pWVar9->cbSize + (ulong)pWVar9->cbSize);
                            pDVar15->wsmp = pWVar9;
                            pDVar15->wsmp_loop = (WLOOP *)connList_ptr;
                          }
                          else if (iVar12 == 0x686e6772) {
                            pDVar15->header = *(RGNHEADER **)((long)data_00 + 0x10);
                          }
                          pPVar21 = (POOLTABLE *)((long)data_00 + 0x20);
                        }
                        uVar20 = (ulong)((uint)uVar20 + 1);
                      }
                      pPVar21 = (POOLTABLE *)((long)PVar5 + 0x20);
                    }
                  }
                  else if (DVar10 == 0x68736e69) {
                    pDVar4 = data->instruments;
                    pDVar14->header = (INSTHEADER *)pDVar4;
                    UVar11 = *(ULONG *)&pDVar4->name;
                    FreeRegions(pDVar14);
                    pDVar15 = (DLS_Region *)calloc(1,(long)(int)(UVar11 * 0x30));
                    pDVar14->regions = pDVar15;
                  }
                }
                ppRVar16 = (RIFF_Chunk **)&data->ptblList;
              }
              uVar17 = (ulong)((uint)uVar17 + 1);
            }
            ppRVar16 = &pRVar7->next;
          }
        }
        else if (DVar10 == 0x6c627470) {
          local_88 = (POOLTABLE *)pRVar13->data;
          data_01->ptbl = local_88;
          data_01->ptblList = (POOLCUE *)((long)&local_88->cbSize + (ulong)local_88->cbSize);
          UVar11 = local_88->cCues;
          FreeWaveList(data_01);
          local_90 = (DLS_Wave *)calloc(1,(long)(int)(UVar11 * 0x28));
          data_01->waveList = local_90;
        }
        else if (DVar10 == 0x6c707677) {
          uVar17 = 0;
          ppRVar16 = &pRVar13->child;
          while (pRVar7 = *ppRVar16, pRVar7 != (RIFF_Chunk *)0x0) {
            DVar10 = pRVar7->magic;
            if (DVar10 == 0x5453494c) {
              DVar10 = pRVar7->subtype;
            }
            if ((DVar10 == 0x65766177) && ((uint)uVar17 < local_88->cCues)) {
              pDVar18 = local_90 + uVar17;
              ppRVar16 = &pRVar7->child;
              while (pRVar8 = *ppRVar16, pRVar8 != (RIFF_Chunk *)0x0) {
                DVar10 = pRVar8->magic;
                if (DVar10 == 0x5453494c) {
                  DVar10 = pRVar8->subtype;
                }
                if (DVar10 == 0x706d7377) {
                  pWVar9 = (WSMPL *)pRVar8->data;
                  uVar2 = pWVar9->cbSize;
                  pDVar18->wsmp = pWVar9;
                  pDVar18->wsmp_loop = (WLOOP *)((long)&pWVar9->cbSize + (ulong)uVar2);
                }
                else if (DVar10 == 0x61746164) {
                  pDVar18->data = pRVar8->data;
                  pDVar18->length = pRVar8->length;
                }
                else if (DVar10 == 0x20746d66) {
                  pDVar18->format = (WaveFMT *)pRVar8->data;
                }
                ppRVar16 = &pRVar8->next;
              }
              uVar17 = (ulong)((uint)uVar17 + 1);
            }
            ppRVar16 = &pRVar7->next;
          }
        }
        else if (DVar10 == 0x686c6f63) {
          uVar1 = *(uint *)pRVar13->data;
          data_01->cInstruments = uVar1;
          FreeInstruments(data_01);
          pDVar14 = (DLS_Instrument *)calloc(1,(long)(int)(uVar1 * 0x28));
          data_01->instruments = pDVar14;
        }
        ppRVar16 = &pRVar13->next;
      } while( true );
    }
    FreeDLS(data_01);
  }
  return (DLS_Data *)0x0;
}

Assistant:

DLS_Data *LoadDLS(FILE *src)
{
	RIFF_Chunk *chunk;
	DLS_Data *data = (DLS_Data *)malloc(sizeof(*data));
	if ( !data ) {
		__Sound_SetError(ERR_OUT_OF_MEMORY);
		return NULL;
	}
	memset(data, 0, sizeof(*data));

	data->chunk = LoadRIFF(src);
	if ( !data->chunk ) {
		FreeDLS(data);
		return NULL;
	}

	for ( chunk = data->chunk->child; chunk; chunk = chunk->next ) {
		DWORD magic = (chunk->magic == FOURCC_LIST) ? chunk->subtype : chunk->magic;
		switch(magic) {
			case FOURCC_COLH:
				Parse_colh(data, chunk);
				break;
			case FOURCC_LINS:
				Parse_lins(data, chunk);
				break;
			case FOURCC_PTBL:
				Parse_ptbl(data, chunk);
				break;
			case FOURCC_WVPL:
				Parse_wvpl(data, chunk);
				break;
			case FOURCC_INFO:
				Parse_INFO_DLS(data, chunk);
				break;
		}
	}
	return data;
}